

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Visitor_tmpl_impl.hpp
# Opt level: O0

void __thiscall
hiberlite::AVisitor<hiberlite::LoadBean>::~AVisitor(AVisitor<hiberlite::LoadBean> *this)

{
  AVisitor<hiberlite::LoadBean> *this_local;
  
  bean_key::~bean_key(&this->rootKey);
  Scope::~Scope(&this->scope);
  std::stack<hiberlite::Scope,_std::deque<hiberlite::Scope,_std::allocator<hiberlite::Scope>_>_>::
  ~stack(&this->stack);
  return;
}

Assistant:

AVisitor<C>::~AVisitor() {}